

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_decoded_utf8_stats *
rf_count_utf8_chars(rf_decoded_utf8_stats *__return_storage_ptr__,char *text,rf_int len)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  rf_decoded_rune decoded_rune;
  rf_decoded_rune local_48;
  
  __return_storage_ptr__->valid_rune_count = 0;
  __return_storage_ptr__->total_rune_count = 0;
  __return_storage_ptr__->bytes_processed = 0;
  __return_storage_ptr__->invalid_bytes = 0;
  if (0 < len && text != (char *)0x0) {
    lVar5 = 0;
    lVar3 = 0;
    lVar2 = 0;
    lVar4 = 0;
    do {
      rf_decode_utf8_char(&local_48,text,len);
      text = text + local_48.bytes_processed;
      lVar4 = lVar4 + local_48.bytes_processed;
      lVar6 = 0;
      if ((ulong)local_48.valid == 0) {
        lVar6 = local_48.bytes_processed;
      }
      lVar2 = lVar2 + lVar6;
      lVar3 = lVar3 + (ulong)local_48.valid;
      lVar5 = lVar5 + 1;
      lVar6 = len - local_48.bytes_processed;
      bVar1 = local_48.bytes_processed <= len;
      len = lVar6;
    } while (lVar6 != 0 && bVar1);
    __return_storage_ptr__->bytes_processed = lVar4;
    __return_storage_ptr__->invalid_bytes = lVar2;
    __return_storage_ptr__->valid_rune_count = lVar3;
    __return_storage_ptr__->total_rune_count = lVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_decoded_utf8_stats rf_count_utf8_chars(const char* text, rf_int len)
{
    rf_decoded_utf8_stats result = {0};

    if (text && len > 0)
    {
        while (len > 0)
        {
            rf_decoded_rune decoded_rune = rf_decode_utf8_char(text, len);

            text += decoded_rune.bytes_processed;
            len  -= decoded_rune.bytes_processed;

            result.bytes_processed  += decoded_rune.bytes_processed;
            result.invalid_bytes    += decoded_rune.valid ? 0 : decoded_rune.bytes_processed;
            result.valid_rune_count += decoded_rune.valid ? 1 : 0;
            result.total_rune_count += 1;
        }
    }

    return result;
}